

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCheck.c
# Opt level: O0

int Abc_NtkCheckUniqueCioNames(Abc_Ntk_t *pNtk)

{
  Nm_Man_t *p;
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Abc_Obj_t *pObj_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  int local_34;
  int fRetValue;
  int nCiId;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObjCi;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_34 = 1;
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcCheck.c"
                  ,0x3a0,"int Abc_NtkCheckUniqueCioNames(Abc_Ntk_t *)");
  }
  fRetValue = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= fRetValue) {
      return local_34;
    }
    pAVar2 = Abc_NtkCo(pNtk,fRetValue);
    p = pNtk->pManName;
    pcVar3 = Abc_ObjName(pAVar2);
    iVar1 = Nm_ManFindIdByNameTwoTypes(p,pcVar3,2,5);
    if (iVar1 != -1) {
      pObj_00 = Abc_NtkObj(pNtk,iVar1);
      pcVar3 = Abc_ObjName(pAVar2);
      pcVar4 = Abc_ObjName(pObj_00);
      iVar1 = strcmp(pcVar3,pcVar4);
      if (iVar1 != 0) {
        __assert_fail("!strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcCheck.c"
                      ,0x3a7,"int Abc_NtkCheckUniqueCioNames(Abc_Ntk_t *)");
      }
      pAVar5 = Abc_ObjFanin0(pAVar2);
      if (pAVar5 != pObj_00) {
        pcVar3 = Abc_ObjName(pAVar2);
        pAVar2 = Abc_ObjFanin0(pAVar2);
        pcVar4 = Abc_ObjName(pAVar2);
        printf("Abc_NtkCheck: A CI/CO pair share the name (%s) but do not link directly. The name of the CO fanin is %s.\n"
               ,pcVar3,pcVar4);
        local_34 = 0;
      }
    }
    fRetValue = fRetValue + 1;
  } while( true );
}

Assistant:

int Abc_NtkCheckUniqueCioNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pObjCi, * pFanin;
    int i, nCiId, fRetValue = 1;
    assert( !Abc_NtkIsNetlist(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        nCiId = Nm_ManFindIdByNameTwoTypes( pNtk->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( nCiId == -1 )
            continue;
        pObjCi = Abc_NtkObj( pNtk, nCiId );
        assert( !strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) ) );
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin != pObjCi )
        {
            printf( "Abc_NtkCheck: A CI/CO pair share the name (%s) but do not link directly. The name of the CO fanin is %s.\n", 
                Abc_ObjName(pObj), Abc_ObjName(Abc_ObjFanin0(pObj)) );
            fRetValue = 0;
        }
    }
    return fRetValue;
}